

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::load_ext_resfiles(CVmImageLoader *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CVmFile *this_00;
  undefined8 *puVar2;
  long *plVar3;
  long in_RDI;
  CVmImageLoaderMres_std res_ifc;
  err_frame_t err_cur__;
  CVmImageLoader *loader;
  CVmImageFile *imagefp;
  CVmFile *fp;
  int fileno;
  char resfile [4096];
  char suffix_uc [4];
  char suffix_lc [4];
  int i;
  CVmFile *in_stack_ffffffffffffee68;
  CVmImageFileExt *in_stack_ffffffffffffee70;
  CVmFile *in_stack_ffffffffffffee78;
  CVmImageLoaderMres_std *in_stack_ffffffffffffee80;
  CVmImageLoader *in_stack_ffffffffffffeeb0;
  uint local_1128 [2];
  CVmImageFileExt *local_1120;
  CVmFile *local_1118;
  CVmImageLoaderMres *in_stack_ffffffffffffef08;
  CVmImageLoader *in_stack_ffffffffffffef10;
  void *local_1038;
  CVmImageLoaderMres_std *local_1030;
  char local_1018 [4100];
  char local_14 [2];
  char local_12;
  char local_10 [2];
  char local_e;
  int local_c;
  
  strcpy(local_10,"3r0");
  strcpy(local_14,"3R0");
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    local_12 = (char)local_c + '0';
    local_e = local_12;
    iVar1 = (*G_host_ifc_X->_vptr_CVmHostIfc[0xf])();
    if (CONCAT44(extraout_var,iVar1) == 0) {
      strcpy(local_1018,*(char **)(in_RDI + 8));
    }
    else {
      iVar1 = (*G_host_ifc_X->_vptr_CVmHostIfc[0xf])();
      in_stack_ffffffffffffeeb0 = (CVmImageLoader *)CONCAT44(extraout_var_00,iVar1);
      os_get_root_name((char *)in_stack_ffffffffffffee70);
      os_build_full_path((char *)in_stack_ffffffffffffee80,(size_t)in_stack_ffffffffffffee78,
                         (char *)in_stack_ffffffffffffee70,(char *)in_stack_ffffffffffffee68);
    }
    os_remext((char *)in_stack_ffffffffffffee70);
    os_addext((char *)in_stack_ffffffffffffee70,(char *)in_stack_ffffffffffffee68);
    iVar1 = access(local_1018,0);
    if (iVar1 != 0) {
      os_remext((char *)in_stack_ffffffffffffee70);
      os_addext((char *)in_stack_ffffffffffffee70,(char *)in_stack_ffffffffffffee68);
    }
    iVar1 = access(local_1018,0);
    if (iVar1 == 0) {
      local_1030 = (CVmImageLoaderMres_std *)0x0;
      local_1038 = (void *)0x0;
      (*G_host_ifc_X->_vptr_CVmHostIfc[10])(G_host_ifc_X,local_1018);
      this_00 = (CVmFile *)operator_new(0x10);
      CVmFile::CVmFile(this_00);
      puVar2 = (undefined8 *)_ZTW11G_err_frame();
      local_1120 = (CVmImageFileExt *)*puVar2;
      plVar3 = (long *)_ZTW11G_err_frame();
      *plVar3 = (long)local_1128;
      local_1128[0] = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffeef0);
      if (local_1128[0] == 0) {
        CVmImageLoaderMres_std::CVmImageLoaderMres_std
                  (in_stack_ffffffffffffee80,(int)((ulong)in_stack_ffffffffffffee78 >> 0x20),
                   (CVmHostIfc *)in_stack_ffffffffffffee70);
        CVmFile::open_read((CVmFile *)in_stack_ffffffffffffee80,(char *)in_stack_ffffffffffffee78,
                           (os_filetype_t)((ulong)in_stack_ffffffffffffee70 >> 0x20));
        local_1030 = (CVmImageLoaderMres_std *)operator_new(0x20);
        CVmImageFileExt::CVmImageFileExt(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
        local_1038 = operator_new(0x98);
        CVmImageLoader((CVmImageLoader *)resfile._3392_8_,(CVmImageFile *)resfile._3384_8_,
                       (char *)resfile._3376_8_,resfile._3368_8_);
        load_resource_file(in_stack_ffffffffffffef10,in_stack_ffffffffffffef08);
        CVmImageLoaderMres_std::~CVmImageLoaderMres_std((CVmImageLoaderMres_std *)0x30b61a);
      }
      if ((local_1128[0] & 0x8000) == 0) {
        local_1128[0] = local_1128[0] | 0x8000;
        if ((local_1038 != (void *)0x0) && (local_1038 != (void *)0x0)) {
          ~CVmImageLoader(in_stack_ffffffffffffeeb0);
          operator_delete(local_1038,0x98);
        }
        if ((local_1030 != (CVmImageLoaderMres_std *)0x0) &&
           (in_stack_ffffffffffffee80 = local_1030, local_1030 != (CVmImageLoaderMres_std *)0x0)) {
          (*(local_1030->super_CVmImageLoaderMres)._vptr_CVmImageLoaderMres[1])();
          in_stack_ffffffffffffee80 = local_1030;
        }
        in_stack_ffffffffffffee78 = this_00;
        if (this_00 != (CVmFile *)0x0) {
          CVmFile::~CVmFile((CVmFile *)in_stack_ffffffffffffee70);
          operator_delete(this_00,0x10);
          in_stack_ffffffffffffee78 = this_00;
        }
      }
      in_stack_ffffffffffffee70 = local_1120;
      puVar2 = (undefined8 *)_ZTW11G_err_frame();
      *puVar2 = in_stack_ffffffffffffee70;
      if ((local_1128[0] & 0x4001) != 0) {
        puVar2 = (undefined8 *)_ZTW11G_err_frame();
        if ((*(uint *)*puVar2 & 2) != 0) {
          plVar3 = (long *)_ZTW11G_err_frame();
          free(*(void **)(*plVar3 + 0x10));
        }
        in_stack_ffffffffffffee68 = local_1118;
        plVar3 = (long *)_ZTW11G_err_frame();
        *(CVmFile **)(*plVar3 + 0x10) = in_stack_ffffffffffffee68;
        err_rethrow();
      }
      if ((local_1128[0] & 2) != 0) {
        free(local_1118);
      }
    }
  }
  return;
}

Assistant:

void CVmImageLoader::load_ext_resfiles(VMG0_)
{
    int i;
    char suffix_lc[4];
    char suffix_uc[4];

    /* set up the templates for the resource file suffix */
    strcpy(suffix_lc, "3r0");
    strcpy(suffix_uc, "3R0");
    
    /* 
     *   Search for resource files with the same name as the image file, but
     *   with the extension replaced with .3r0 through .3r9.  Try both
     *   lower-case and upper-case names (in that order), in case the file
     *   system is case-sensitive.  
     */
    for (i = 0 ; i < 10 ; ++i)
    {
        char resfile[OSFNMAX];
        
        /* substitute the current suffix number */
        suffix_lc[2] = suffix_uc[2] = i + '0';

        /* 
         *   if there's an explicit resource path, use it, otherwise use
         *   the same directory that contains the image file 
         */
        if (G_host_ifc->get_res_path() != 0)
        {
            /* 
             *   there's an explicit resource path - build the full path to
             *   the resource file using the resource path and the root name
             *   of the image file 
             */
            os_build_full_path(resfile, sizeof(resfile),
                               G_host_ifc->get_res_path(),
                               os_get_root_name(fname_));
        }
        else
        {
            /* 
             *   there's no resoruce path - use the image file full name,
             *   including any directory path information 
             */
            strcpy(resfile, fname_);
        }

        /* replace the old image file extension with the resource suffix */
        os_remext(resfile);
        os_addext(resfile, suffix_lc);

        /* if this file doesn't exist, try the upper-case name */
        if (osfacc(resfile))
        {
            /* replace the suffix with the upper-case version */
            os_remext(resfile);
            os_addext(resfile, suffix_uc);
        }

        /* check to see if this file exists */
        if (!osfacc(resfile))
        {
            int fileno;
            CVmFile *fp;
            CVmImageFile *volatile imagefp = 0;
            CVmImageLoader *volatile loader = 0;
            
            /* ask the host system to assign a file number */
            fileno = G_host_ifc->add_resfile(resfile);

            /* create a file object for reading the file */
            fp = new CVmFile();

            err_try
            {
                CVmImageLoaderMres_std res_ifc(fileno, G_host_ifc);

                /* open the file */
                fp->open_read(resfile, OSFTT3IMG);

                /* set up the loader */
                imagefp = new CVmImageFileExt(fp);
                loader = new CVmImageLoader(imagefp, resfile, 0);

                /* load the resource-only file */
                loader->load_resource_file(&res_ifc);
            }
            err_finally
            {
                /* delete the objects we created */
                if (loader != 0)
                    delete loader;
                if (imagefp != 0)
                    delete imagefp;
                delete fp;
            }
            err_end;
        }